

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_compressionJob(void *jobDescription)

{
  ldmState_t *ldmState;
  uint uVar1;
  unsigned_long_long pledgedSrcSize;
  long lVar2;
  ZSTD_customMem customMem;
  int iVar3;
  ZSTD_CCtx *cctx;
  size_t sVar4;
  unsigned_long_long *puVar5;
  ulong uVar6;
  void *src;
  void *dst;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  pthread_mutex_t *ppVar12;
  long lVar13;
  bool bVar14;
  buffer_t bVar15;
  buffer_t buf;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  ldmParams_t *params;
  void *in_stack_fffffffffffffe90;
  rawSeq *prVar16;
  ulong local_158;
  rawSeqStore_t local_128;
  ZSTD_CCtx_params jobParams;
  
  memcpy(&jobParams,(void *)((long)jobDescription + 200),0xd0);
  ppVar12 = *(pthread_mutex_t **)((long)jobDescription + 0x68);
  pthread_mutex_lock(ppVar12);
  iVar3 = *(int *)((long)ppVar12 + 0x2c);
  if ((long)iVar3 == 0) {
    pthread_mutex_unlock(ppVar12);
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe88;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffe80;
    customMem.opaque = in_stack_fffffffffffffe90;
    cctx = ZSTD_createCCtx_advanced(customMem);
  }
  else {
    *(int *)((long)ppVar12 + 0x2c) = iVar3 + -1;
    cctx = *(ZSTD_CCtx **)((long)ppVar12 + (long)iVar3 * 8 + 0x40);
    pthread_mutex_unlock(ppVar12);
  }
  if ((*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78))->bufferSize == 0) {
    prVar16 = (rawSeq *)0x0;
    local_158 = 0;
  }
  else {
    bVar15 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x78));
    prVar16 = (rawSeq *)bVar15.start;
    local_158 = bVar15.capacity / 0xc;
  }
  plVar7 = (long *)jobDescription;
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_001db313:
    pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
    *(undefined8 *)((long)jobDescription + 8) = 0xffffffffffffffc0;
  }
  else {
    if (*(void **)((long)jobDescription + 0x88) == (void *)0x0) {
      bVar15 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobDescription + 0x70));
      if (bVar15.start == (void *)0x0) goto LAB_001db313;
      *(buffer_t *)((long)jobDescription + 0x88) = bVar15;
    }
    else {
      bVar15.capacity = *(size_t *)((long)jobDescription + 0x90);
      bVar15.start = *(void **)((long)jobDescription + 0x88);
    }
    dst = bVar15.start;
    if ((jobParams.ldmParams.enableLdm == ZSTD_ps_enable) && (prVar16 == (rawSeq *)0x0))
    goto LAB_001db313;
    if (*(int *)((long)jobDescription + 0xb8) != 0) {
      jobParams.fParams.checksumFlag = 0;
    }
    jobParams.ldmParams.enableLdm = ZSTD_ps_disable;
    jobParams.nbWorkers = 0;
    if (*(ZSTD_CDict **)((long)jobDescription + 0x198) == (ZSTD_CDict *)0x0) {
      bVar14 = *(int *)((long)jobDescription + 0xbc) == 0;
      puVar5 = (unsigned_long_long *)((long)jobDescription + 0x1a0);
      if (bVar14) {
        puVar5 = (unsigned_long_long *)((long)jobDescription + 0xb0);
      }
      pledgedSrcSize = *puVar5;
      jobParams.forceWindow = (int)bVar14;
      if (((!bVar14) ||
          (sVar4 = ZSTD_CCtxParams_setParameter(&jobParams,ZSTD_c_experimentalParam15,0),
          sVar4 < 0xffffffffffffff89)) &&
         (sVar4 = ZSTD_compressBegin_advanced_internal
                            (cctx,*(void **)((long)jobDescription + 0x98),
                             *(size_t *)((long)jobDescription + 0xa0),ZSTD_dct_rawContent,
                             ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&jobParams,pledgedSrcSize),
         sVar4 < 0xffffffffffffff89)) goto LAB_001db412;
LAB_001db73a:
      pthread_mutex_lock((pthread_mutex_t *)((long)jobDescription + 0x10));
LAB_001db7bb:
      plVar7[1] = sVar4;
    }
    else {
      sVar4 = ZSTD_compressBegin_advanced_internal
                        (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                         *(ZSTD_CDict **)((long)jobDescription + 0x198),&jobParams,
                         *(unsigned_long_long *)((long)jobDescription + 0x1a0));
      if (*(int *)((long)jobDescription + 0xbc) == 0) {
        __assert_fail("job->firstJob",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87a3,"void ZSTDMT_compressionJob(void *)");
      }
      if (0xffffffffffffff88 < sVar4) goto LAB_001db73a;
LAB_001db412:
      ppVar12 = *(pthread_mutex_t **)((long)jobDescription + 0x80);
      pvVar11 = *(void **)((long)jobDescription + 0xa8);
      uVar1 = *(uint *)((long)jobDescription + 0xb8);
      uVar6 = *(ulong *)((long)jobDescription + 0xb0);
      local_128.pos = 0;
      local_128.posInSequence = 0;
      local_128.size = 0;
      local_128.capacity = local_158;
      local_128.seq = prVar16;
      pthread_mutex_lock(ppVar12);
      while (*(uint *)((long)ppVar12 + 0x9c0) < uVar1) {
        pthread_cond_wait((pthread_cond_t *)(ppVar12 + 1),ppVar12);
      }
      if (*(uint *)((long)ppVar12 + 0x9c0) == uVar1) {
        if (*(int *)((long)ppVar12 + 0xb8) == 1) {
          if (((prVar16 == (rawSeq *)0x0) || (local_128.pos != 0)) ||
             ((local_128.size != 0 || (local_158 == 0)))) {
            __assert_fail("seqStore.seq != NULL && seqStore.pos == 0 && seqStore.size == 0 && seqStore.capacity > 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x872a,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
          if (*(ulong *)((long)ppVar12 + 0xa8) < uVar6) {
            __assert_fail("src.size <= serialState->params.jobSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x872b,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
          params = (ldmParams_t *)((long)ppVar12 + 0xb8);
          ldmState = (ldmState_t *)((long)ppVar12 + 0x128);
          ZSTD_window_update((ZSTD_window_t *)ldmState,pvVar11,uVar6,0);
          sVar4 = ZSTD_ldm_generateSequences(ldmState,&local_128,params,pvVar11,uVar6);
          if (0xffffffffffffff88 < sVar4) {
            __assert_fail("!ZSTD_isError(error)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8731,
                          "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                         );
          }
          pthread_mutex_lock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
          *(BYTE **)((long)ppVar12 + 0xa20) = (ldmState->window).nextSrc;
          ppVar12[0x41].__align = *(long *)((long)ppVar12 + 0x130);
          *(undefined8 *)((long)ppVar12 + 0xa30) = *(undefined8 *)((long)ppVar12 + 0x138);
          *(long *)((long)ppVar12 + 0xa38) = ppVar12[8].__align;
          *(undefined8 *)((long)ppVar12 + 0xa40) = *(undefined8 *)((long)ppVar12 + 0x148);
          pthread_cond_signal((pthread_cond_t *)((long)ppVar12 + 0x9f0));
          pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
        }
        if (uVar6 != 0 && *(int *)((long)ppVar12 + 0x7c) != 0) {
          XXH_INLINE_XXH64_update
                    ((XXH_NAMESPACEXXH64_state_t *)((long)ppVar12 + 0x968),pvVar11,uVar6);
        }
      }
      *(int *)((long)ppVar12 + 0x9c0) = *(int *)((long)ppVar12 + 0x9c0) + 1;
      pthread_cond_broadcast((pthread_cond_t *)(ppVar12 + 1));
      pthread_mutex_unlock(ppVar12);
      if (local_128.size != 0) {
        sVar4 = ZSTD_referenceExternalSequences(cctx,local_128.seq,local_128.size);
        if (*(int *)((long)ppVar12 + 0xb8) != 1) {
          __assert_fail("serialState->params.ldmParams.enableLdm == ZSTD_ps_enable",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8745,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
        if (0xffffffffffffff88 < sVar4) {
          __assert_fail("!ZSTD_isError(err)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8746,
                        "void ZSTDMT_serialState_update(serialState_t *, ZSTD_CCtx *, rawSeqStore_t, range_t, unsigned int)"
                       );
        }
      }
      if (*(int *)((long)jobDescription + 0xbc) == 0) {
        sVar4 = ZSTD_compressContinue_public
                          (cctx,dst,bVar15.capacity,*(void **)((long)jobDescription + 0xa8),0);
        if (0xffffffffffffff88 < sVar4) goto LAB_001db73a;
        ZSTD_invalidateRepCodes(cctx);
      }
      if (0x7ffffffe < *(ulong *)((long)jobDescription + 0xb0) >> 0x13) {
        __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87c8,"void ZSTDMT_compressionJob(void *)");
      }
      if (*(long *)((long)jobDescription + 8) != 0) {
        __assert_fail("job->cSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x87ca,"void ZSTDMT_compressionJob(void *)");
      }
      pvVar11 = (void *)(bVar15.capacity + (long)dst);
      lVar2 = *(long *)((long)jobDescription + 0xa8);
      iVar3 = (int)(*(ulong *)((long)jobDescription + 0xb0) + 0x7ffff >> 0x13);
      lVar8 = 1;
      lVar13 = 0x80000;
      while( true ) {
        ppVar12 = (pthread_mutex_t *)((long)jobDescription + 0x10);
        src = (void *)(lVar2 + lVar13 + -0x80000);
        if (iVar3 <= lVar8) break;
        sVar4 = ZSTD_compressContinue_public(cctx,dst,(long)pvVar11 - (long)dst,src,0x80000);
        if (0xffffffffffffff88 < sVar4) {
          pthread_mutex_lock(ppVar12);
          goto LAB_001db7bb;
        }
        dst = (void *)((long)dst + sVar4);
        if (pvVar11 <= dst) {
          __assert_fail("op < oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x87cf,"void ZSTDMT_compressionJob(void *)");
        }
        pthread_mutex_lock(ppVar12);
        plVar7[1] = plVar7[1] + sVar4;
        *plVar7 = lVar13;
        pthread_cond_signal((pthread_cond_t *)((long)jobDescription + 0x38));
        pthread_mutex_unlock(ppVar12);
        lVar8 = lVar8 + 1;
        lVar13 = lVar13 + 0x80000;
      }
      if (iVar3 < 1 && (int)plVar7[0x18] == 0) {
        uVar6 = 0;
LAB_001db912:
        if ((*(int *)((long)plVar7 + 0xbc) == 0) &&
           ((cctx->blockState).matchState.window.lowLimit <
            (cctx->blockState).matchState.window.dictLimit)) {
          __assert_fail("!ZSTD_window_hasExtDict(cctx->blockState.matchState.window)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x87e9,"void ZSTDMT_compressionJob(void *)");
        }
        goto LAB_001db7ca;
      }
      uVar6 = plVar7[0x16];
      uVar9 = (ulong)((uint)uVar6 & 0x7ffff);
      uVar10 = uVar9;
      if ((uVar6 & 0x7ffff) == 0) {
        uVar10 = 0x80000;
      }
      if (uVar6 < 0x80000) {
        uVar10 = uVar9;
      }
      if ((int)plVar7[0x18] == 0) {
        uVar6 = ZSTD_compressContinue_public(cctx,dst,(long)pvVar11 - (long)dst,src,uVar10);
      }
      else {
        uVar6 = ZSTD_compressEnd_public(cctx,dst,(long)pvVar11 - (long)dst,src,uVar10);
      }
      if (uVar6 < 0xffffffffffffff89) goto LAB_001db912;
      pthread_mutex_lock(ppVar12);
      plVar7[1] = uVar6;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)jobDescription + 0x10));
  uVar6 = 0;
LAB_001db7ca:
  uVar10 = plVar7[1];
  ppVar12 = (pthread_mutex_t *)plVar7[0x10];
  uVar1 = *(uint *)(plVar7 + 0x17);
  pthread_mutex_lock(ppVar12);
  if (*(uint *)((long)ppVar12 + 0x9c0) <= uVar1) {
    if (uVar10 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(cSize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8750,
                    "void ZSTDMT_serialState_ensureFinished(serialState_t *, unsigned int, size_t)")
      ;
    }
    *(uint *)((long)ppVar12 + 0x9c0) = uVar1 + 1;
    pthread_cond_broadcast((pthread_cond_t *)(ppVar12 + 1));
    pthread_mutex_lock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
    iVar3 = *(int *)((long)ppVar12 + 0xa20) - ppVar12[0x41].__data.__lock;
    *(int *)((long)ppVar12 + 0xa3c) = iVar3;
    *(int *)((long)ppVar12 + 0xa38) = iVar3;
    pthread_cond_signal((pthread_cond_t *)((long)ppVar12 + 0x9f0));
    pthread_mutex_unlock((pthread_mutex_t *)((long)ppVar12 + 0x9c8));
  }
  pthread_mutex_unlock(ppVar12);
  buf.capacity = local_158 * 0xc;
  buf.start = prVar16;
  ZSTDMT_releaseBuffer((ZSTDMT_bufferPool *)plVar7[0xf],buf);
  if (cctx != (ZSTD_CCtx *)0x0) {
    ppVar12 = (pthread_mutex_t *)plVar7[0xd];
    pthread_mutex_lock(ppVar12);
    iVar3 = *(int *)((long)ppVar12 + 0x2c);
    if (iVar3 < ppVar12[1].__data.__lock) {
      *(int *)((long)ppVar12 + 0x2c) = iVar3 + 1;
      *(ZSTD_CCtx **)((long)ppVar12 + (long)iVar3 * 8 + 0x48) = cctx;
    }
    else {
      ZSTD_freeCCtx(cctx);
    }
    pthread_mutex_unlock(ppVar12);
  }
  pthread_mutex_lock((pthread_mutex_t *)(plVar7 + 2));
  if (uVar6 != 0 && 0xffffffffffffff88 < (ulong)plVar7[1]) {
    __assert_fail("lastCBlockSize == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x87f7,"void ZSTDMT_compressionJob(void *)");
  }
  plVar7[1] = plVar7[1] + uVar6;
  *plVar7 = plVar7[0x16];
  pthread_cond_signal((pthread_cond_t *)(plVar7 + 7));
  pthread_mutex_unlock((pthread_mutex_t *)(plVar7 + 2));
  return;
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm == ZSTD_ps_enable && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = ZSTD_ps_disable;
    /* Correct nbWorkers to 0. */
    jobParams.nbWorkers = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        if (!job->firstJob) {
            size_t const err = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_deterministicRefPrefix, 0);
            if (ZSTD_isError(err)) JOB_ERROR(err);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue_public(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue_public(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd_public(cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue_public(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }
    if (!job->firstJob) {
        /* Double check that we don't have an ext-dict, because then our
         * repcode invalidation doesn't work.
         */
        assert(!ZSTD_window_hasExtDict(cctx->blockState.matchState.window));
    }
    ZSTD_CCtx_trace(cctx, 0);

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}